

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions.c
# Opt level: O3

_InstInfo * inst_lookup_3dnow(_CodeInfo *ci)

{
  byte bVar1;
  ushort uVar2;
  _InstNode _Var3;
  _InstInfo *p_Var4;
  
  _Var3 = Table_0F_0F;
  if (0 < ci->codeLen) {
    bVar1 = *ci->code;
    ci->codeLen = ci->codeLen + -1;
    ci->code = ci->code + 1;
    uVar2 = InstructionsTree[(_Var3 & 0x1fff) + (uint)bVar1];
    if (uVar2 != 0) {
      p_Var4 = (_InstInfo *)
               ((long)&InstInfosEx[0].BASE.sharedIndex + (ulong)((uVar2 & 0x1fff) * 0xc));
      if ((uVar2 & 0xe000) == 0x2000) {
        p_Var4 = (_InstInfo *)((long)&InstInfos[0].sharedIndex + (ulong)((uVar2 & 0x1fff) * 4));
      }
      return p_Var4;
    }
  }
  return (_InstInfo *)0x0;
}

Assistant:

_InstInfo* inst_lookup_3dnow(_CodeInfo* ci)
{
	/* Start off from the two escape bytes gates... which is 3DNow! table.*/
	_InstNode in = Table_0F_0F;

	int index;

	/* Make sure we can read a byte off the stream. */
	if (ci->codeLen < 1) return NULL;

	index = *ci->code;

	ci->codeLen -= 1;
	ci->code += 1;
	return inst_get_info(in, index);
}